

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O0

void __thiscall OSSLRSAPrivateKey::setFromOSSL(OSSLRSAPrivateKey *this,RSA *inRSA)

{
  undefined8 in_RSI;
  BIGNUM *in_RDI;
  ByteString inD;
  ByteString inE;
  ByteString inN;
  ByteString inPQ;
  ByteString inDQ1;
  ByteString inDP1;
  ByteString inQ;
  ByteString inP;
  BIGNUM *bn_d;
  BIGNUM *bn_e;
  BIGNUM *bn_n;
  BIGNUM *bn_iqmp;
  BIGNUM *bn_dmq1;
  BIGNUM *bn_dmp1;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  undefined1 local_1a0 [40];
  undefined1 local_178 [40];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  undefined1 local_100 [40];
  undefined1 local_d8 [40];
  undefined1 local_b0 [56];
  undefined1 local_78 [40];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  local_18 = 0;
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_10 = in_RSI;
  RSA_get0_factors(in_RSI,&local_18,&local_20);
  RSA_get0_crt_params(local_10,&local_28,&local_30,&local_38);
  RSA_get0_key(local_10,&local_40,&local_48,&local_50);
  if (local_18 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x40))(in_RDI,local_78);
    ByteString::~ByteString((ByteString *)0x13a8f2);
  }
  if (local_20 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x48))(in_RDI,local_b0);
    ByteString::~ByteString((ByteString *)0x13a961);
  }
  if (local_28 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,local_d8);
    ByteString::~ByteString((ByteString *)0x13a9d0);
  }
  if (local_30 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,local_100);
    ByteString::~ByteString((ByteString *)0x13aa3f);
  }
  if (local_38 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,local_128);
    ByteString::~ByteString((ByteString *)0x13aaae);
  }
  if (local_40 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x70))(in_RDI,local_150);
    ByteString::~ByteString((ByteString *)0x13ab1d);
  }
  if (local_48 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,local_178);
    ByteString::~ByteString((ByteString *)0x13ab86);
  }
  if (local_50 != 0) {
    OSSL::bn2ByteString(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,local_1a0);
    ByteString::~ByteString((ByteString *)0x13abe7);
  }
  return;
}

Assistant:

void OSSLRSAPrivateKey::setFromOSSL(const RSA* inRSA)
{
	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_dmp1 = NULL;
	const BIGNUM* bn_dmq1 = NULL;
	const BIGNUM* bn_iqmp = NULL;
	const BIGNUM* bn_n = NULL;
	const BIGNUM* bn_e = NULL;
	const BIGNUM* bn_d = NULL;

	RSA_get0_factors(inRSA, &bn_p, &bn_q);
	RSA_get0_crt_params(inRSA, &bn_dmp1, &bn_dmq1, &bn_iqmp);
	RSA_get0_key(inRSA, &bn_n, &bn_e, &bn_d);

	if (bn_p)
	{
		ByteString inP = OSSL::bn2ByteString(bn_p);
		setP(inP);
	}
	if (bn_q)
	{
		ByteString inQ = OSSL::bn2ByteString(bn_q);
		setQ(inQ);
	}
	if (bn_dmp1)
	{
		ByteString inDP1 = OSSL::bn2ByteString(bn_dmp1);
		setDP1(inDP1);
	}
	if (bn_dmq1)
	{
		ByteString inDQ1 = OSSL::bn2ByteString(bn_dmq1);
		setDQ1(inDQ1);
	}
	if (bn_iqmp)
	{
		ByteString inPQ = OSSL::bn2ByteString(bn_iqmp);
		setPQ(inPQ);
	}
	if (bn_n)
	{
		ByteString inN = OSSL::bn2ByteString(bn_n);
		setN(inN);
	}
	if (bn_e)
	{
		ByteString inE = OSSL::bn2ByteString(bn_e);
		setE(inE);
	}
	if (bn_d)
	{
		ByteString inD = OSSL::bn2ByteString(bn_d);
		setD(inD);
	}
}